

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* BotListUnserialize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *serialized)

{
  const_iterator cVar1;
  const_iterator cVar2;
  iterator iVar3;
  string *serialized_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *bots;
  
  util::explode(__return_storage_ptr__,',',serialized);
  cVar1 = util::cbegin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (__return_storage_ptr__);
  cVar2 = util::cend<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    (__return_storage_ptr__);
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(__return_storage_ptr__);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,BotListUnserialize(std::__cxx11::string)::__0>
            (cVar1._M_current,cVar2._M_current,iVar3._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> BotListUnserialize(std::string serialized)
{
	std::vector<std::string> bots = util::explode(',', serialized);
	std::transform(UTIL_CRANGE(bots), bots.begin(), [](std::string s)
								 { return util::lowercase(util::trim(s)); });
	return bots;
}